

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_function.h
# Opt level: O1

void dukglue_register_function<void>(duk_context *ctx,_func_void *funcToCall,char *name)

{
  duk_push_c_function(ctx,dukglue::detail::FuncInfoHolder<void>::FuncRuntime::call_native_function,0
                     );
  duk_push_pointer(ctx,funcToCall);
  duk_put_prop_string(ctx,-2,anon_var_dwarf_f54e);
  duk_put_global_string(ctx,name);
  return;
}

Assistant:

void dukglue_register_function(duk_context* ctx, RetType(*funcToCall)(Ts...), const char* name)
{
	duk_c_function evalFunc = dukglue::detail::FuncInfoHolder<RetType, Ts...>::FuncRuntime::call_native_function;

	duk_push_c_function(ctx, evalFunc, sizeof...(Ts));

  static_assert(sizeof(RetType(*)(Ts...)) == sizeof(void*), "Function pointer and data pointer are different sizes");
	duk_push_pointer(ctx, reinterpret_cast<void*>(funcToCall));
	duk_put_prop_string(ctx, -2, "\xFF" "func_ptr");

	duk_put_global_string(ctx, name);
}